

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::updateAPF(HFactor *this,HVector *aq,HVector *ep,HighsInt iRow)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  int iVar2;
  HFactor *pHVar3;
  HighsInt *pHVar4;
  long lVar5;
  long lVar6;
  HighsInt i;
  long lVar7;
  double local_60;
  vector<int,_std::allocator<int>_> *local_58;
  long local_50;
  HFactor *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_50 = CONCAT44(local_50._4_4_,iRow);
  local_58 = &this->pf_index;
  pvVar1 = &this->pf_value;
  lVar5 = 0;
  lVar6 = 0;
  local_48 = this;
  for (lVar7 = 0; pHVar3 = local_48, lVar7 < aq->packCount; lVar7 = lVar7 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (local_58,(value_type_conflict2 *)
                        ((long)(aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start + lVar6));
    std::vector<double,_std::allocator<double>_>::push_back
              (pvVar1,(value_type_conflict1 *)
                      ((long)(aq->packValue).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar6 = lVar6 + 4;
    lVar5 = lVar5 + 8;
  }
  local_50 = (long)(int)local_50;
  iVar2 = local_48->basic_index[local_50];
  local_40 = pvVar1;
  if (iVar2 < local_48->num_col) {
    pHVar4 = local_48->a_start;
    lVar6 = (long)pHVar4[iVar2];
    lVar5 = lVar6 * 4;
    for (; lVar6 < pHVar4[(long)iVar2 + 1]; lVar6 = lVar6 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (local_58,(value_type_conflict2 *)((long)pHVar3->a_index + lVar5));
      local_60 = -*(double *)((long)pHVar3->a_value + lVar5 * 2);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_40,&local_60);
      pHVar4 = pHVar3->a_start;
      lVar5 = lVar5 + 4;
    }
  }
  else {
    local_60 = (double)CONCAT44(local_60._4_4_,iVar2 - local_48->num_col);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_58,(int *)&local_60);
    local_60 = -1.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(pvVar1,&local_60);
  }
  local_38 = &pHVar3->pf_start;
  local_60 = (double)CONCAT44(local_60._4_4_,
                              (int)((ulong)((long)(pHVar3->pf_index).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pHVar3->pf_index).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_38,(int *)&local_60);
  pvVar1 = local_40;
  lVar5 = 0;
  lVar6 = 0;
  for (lVar7 = 0; pHVar3 = local_48, lVar7 < ep->packCount; lVar7 = lVar7 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (local_58,(value_type_conflict2 *)
                        ((long)(ep->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start + lVar6));
    std::vector<double,_std::allocator<double>_>::push_back
              (pvVar1,(value_type_conflict1 *)
                      ((long)(ep->packValue).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar6 = lVar6 + 4;
    lVar5 = lVar5 + 8;
  }
  local_60 = (double)CONCAT44(local_60._4_4_,
                              (int)((ulong)((long)(local_48->pf_index).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_48->pf_index).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_38,(int *)&local_60);
  std::vector<double,_std::allocator<double>_>::push_back
            (&pHVar3->pf_pivot_value,
             (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + local_50);
  return;
}

Assistant:

void HFactor::updateAPF(HVector* aq, HVector* ep, HighsInt iRow
                        //, HighsInt* hint
) {
  // Store elements
  for (HighsInt i = 0; i < aq->packCount; i++) {
    pf_index.push_back(aq->packIndex[i]);
    pf_value.push_back(aq->packValue[i]);
  }

  HighsInt variable_out = basic_index[iRow];
  if (variable_out >= num_col) {
    pf_index.push_back(variable_out - num_col);
    pf_value.push_back(-1);
  } else {
    for (HighsInt k = a_start[variable_out]; k < a_start[variable_out + 1];
         k++) {
      pf_index.push_back(a_index[k]);
      pf_value.push_back(-a_value[k]);
    }
  }
  pf_start.push_back(pf_index.size());

  for (HighsInt i = 0; i < ep->packCount; i++) {
    pf_index.push_back(ep->packIndex[i]);
    pf_value.push_back(ep->packValue[i]);
  }
  pf_start.push_back(pf_index.size());

  // Store pivot
  pf_pivot_value.push_back(aq->array[iRow]);
}